

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoplus.cpp
# Opt level: O1

void __thiscall EOPlus::op_info_lut_init::op_info_lut_init(op_info_lut_init *this)

{
  undefined8 uVar1;
  long lVar2;
  logic_error *this_00;
  long lVar3;
  
  if (!op_info_lut_init::initialized) {
    op_info_lut_init::initialized = true;
    lVar2 = 0;
    do {
      lVar3 = (ulong)(byte)(&op_info_table)[lVar2] * 0x10;
      if (op_info_lut[lVar3] != '\0') {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"UOP2 hash collision");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      uVar1 = *(undefined8 *)(&UNK_001a6018 + lVar2);
      *(undefined8 *)(op_info_lut + lVar3) = *(undefined8 *)(&op_info_table + lVar2);
      *(undefined8 *)(op_info_lut + lVar3 + 8) = uVar1;
      lVar2 = lVar2 + 0x10;
    } while (lVar2 != 0x130);
  }
  return;
}

Assistant:

op_info_lut_init()
		{
			typedef unsigned char uc;
			static bool initialized;

			if (!initialized)
			{
				initialized = true;

				for (std::size_t i = 0; i < sizeof(op_info_table) / sizeof(op_info_table[0]); ++i)
				{
					if (op_info_lut[uc(op_info_table[i].op)].op != Operator(0))
						throw std::logic_error("UOP2 hash collision");

					op_info_lut[uc(op_info_table[i].op)] = op_info_table[i];
				}
			}
		}